

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O3

cx_string<3UL> mserialize::cx_strcat<1ul,2ul>(cx_string<1UL> *strings,cx_string<2UL> *strings_1)

{
  char acVar1 [4];
  cx_string<3UL> cVar2;
  char *pcVar3;
  size_t i;
  long lVar4;
  ulong uVar5;
  char buffer [4];
  size_t size [3];
  char *data [3];
  
  pcVar3 = buffer;
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  data[1] = strings->_data;
  data[2] = strings_1->_data;
  size[1] = 1;
  size[2] = 2;
  lVar4 = 1;
  do {
    if (size[lVar4] != 0) {
      uVar5 = 0;
      do {
        pcVar3[uVar5] = data[lVar4][uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar5 < size[lVar4]);
      pcVar3 = pcVar3 + uVar5;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  acVar1 = (char  [4])((uint)buffer & 0xffffff);
  cVar2._data[0] = acVar1[0];
  cVar2._data[1] = acVar1[1];
  cVar2._data[2] = acVar1[2];
  cVar2._data[3] = acVar1[3];
  return (cx_string<3UL>)cVar2._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}